

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtraction.h
# Opt level: O3

void __thiscall Subtraction_Simple_Test::~Subtraction_Simple_Test(Subtraction_Simple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Subtraction, Simple)
{
    BigNumber num_1 = BigNumber("0") - BigNumber("0");
    BigNumber num_2 = BigNumber("0") - BigNumber("1");
    BigNumber num_3 = BigNumber("-1") - BigNumber("1");
    BigNumber num_4 = BigNumber("-1") - BigNumber("0");
    EXPECT_EQ("0", num_1.toString());
    EXPECT_EQ("-1", num_2.toString());
    EXPECT_EQ("-2", num_3.toString());
    EXPECT_EQ("-1", num_4.toString());
}